

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O0

vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
* vkt::tessellation::readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
            (vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             *__return_storage_ptr__,int count,void *memory,int offset,int stride)

{
  reference dst;
  int local_4c;
  void *pvStack_48;
  int i;
  deUint8 *pData;
  allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> local_2a;
  undefined1 local_29;
  int local_28;
  int local_24;
  int stride_local;
  int offset_local;
  void *memory_local;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *pvStack_10;
  int count_local;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *results;
  
  local_29 = 0;
  local_28 = stride;
  local_24 = offset;
  _stride_local = memory;
  memory_local._4_4_ = count;
  pvStack_10 = __return_storage_ptr__;
  std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>::allocator(&local_2a);
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::vector(__return_storage_ptr__,(long)count,&local_2a);
  std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>::~allocator(&local_2a);
  pvStack_48 = (void *)((long)_stride_local + (long)local_24);
  for (local_4c = 0; local_4c < memory_local._4_4_; local_4c = local_4c + 1) {
    dst = std::
          vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::operator[](__return_storage_ptr__,(long)local_4c);
    ::deMemcpy(dst,pvStack_48,0x40);
    pvStack_48 = (void *)((long)pvStack_48 + (long)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> readInterleavedData (const int count, const void* memory, const int offset, const int stride)
{
	std::vector<T> results(count);
	const deUint8* pData = static_cast<const deUint8*>(memory) + offset;

	for (int i = 0; i < count; ++i)
	{
		deMemcpy(&results[i], pData, sizeof(T));
		pData += stride;
	}

	return results;
}